

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlPopPE(xmlParserCtxtPtr ctxt)

{
  xmlEntityPtr pxVar1;
  int iVar2;
  xmlParserInputPtr input;
  int result;
  xmlEntityPtr ent;
  unsigned_long consumed;
  xmlParserCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->input->entity;
  pxVar1->flags = pxVar1->flags & 0xfffffff7;
  consumed = (unsigned_long)ctxt;
  if ((pxVar1->flags & 2U) == 0) {
    do {
      *(undefined8 *)(*(long *)(consumed + 0x38) + 0x20) =
           *(undefined8 *)(*(long *)(consumed + 0x38) + 0x28);
      xmlParserShrink((xmlParserCtxtPtr)consumed);
      iVar2 = xmlParserGrow((xmlParserCtxtPtr)consumed);
    } while (0 < iVar2);
    ent = *(xmlEntityPtr *)(*(long *)(consumed + 0x38) + 0x40);
    xmlSaturatedAddSizeT
              ((unsigned_long *)&ent,
               *(long *)(*(long *)(consumed + 0x38) + 0x28) -
               *(long *)(*(long *)(consumed + 0x38) + 0x18));
    xmlSaturatedAdd(&pxVar1->expandedSize,(unsigned_long)ent);
    if (pxVar1->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
      xmlSaturatedAdd((unsigned_long *)(consumed + 0x2c0),(unsigned_long)ent);
    }
    pxVar1->flags = pxVar1->flags | 2;
  }
  input = xmlCtxtPopInput((xmlParserCtxtPtr)consumed);
  xmlFreeInputStream(input);
  xmlParserEntityCheck((xmlParserCtxtPtr)consumed,pxVar1->expandedSize);
  if (((*(uint *)(*(long *)(consumed + 0x38) + 0x60) & 0x40) == 0) &&
     (*(long *)(*(long *)(consumed + 0x38) + 0x28) - *(long *)(*(long *)(consumed + 0x38) + 0x20) <
      0xfa)) {
    xmlParserGrow((xmlParserCtxtPtr)consumed);
  }
  return;
}

Assistant:

static void
xmlPopPE(xmlParserCtxtPtr ctxt) {
    unsigned long consumed;
    xmlEntityPtr ent;

    ent = ctxt->input->entity;

    ent->flags &= ~XML_ENT_EXPANDING;

    if ((ent->flags & XML_ENT_CHECKED) == 0) {
        int result;

        /*
         * Read the rest of the stream in case of errors. We want
         * to account for the whole entity size.
         */
        do {
            ctxt->input->cur = ctxt->input->end;
            xmlParserShrink(ctxt);
            result = xmlParserGrow(ctxt);
        } while (result > 0);

        consumed = ctxt->input->consumed;
        xmlSaturatedAddSizeT(&consumed,
                             ctxt->input->end - ctxt->input->base);

        xmlSaturatedAdd(&ent->expandedSize, consumed);

        /*
         * Add to sizeentities when parsing an external entity
         * for the first time.
         */
        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);
        }

        ent->flags |= XML_ENT_CHECKED;
    }

    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    xmlParserEntityCheck(ctxt, ent->expandedSize);

    GROW;
}